

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

uint l_randomizePivot(void)

{
  clock_t cVar1;
  time_t tVar2;
  uint local_30;
  uint local_2c;
  uint rnd;
  uint i;
  uint buff [4];
  time_t t;
  clock_t c;
  
  cVar1 = clock();
  tVar2 = time((time_t *)0x0);
  local_30 = 0;
  _rnd = cVar1;
  buff[0] = (int)tVar2;
  buff[1] = (int)((ulong)tVar2 >> 0x20);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    local_30 = (&rnd)[local_2c] + local_30;
  }
  return local_30;
}

Assistant:

static unsigned int l_randomizePivot (void) {
  clock_t c = clock();
  time_t t = time(NULL);
  unsigned int buff[sof(c) + sof(t)];
  unsigned int i, rnd = 0;
  memcpy(buff, &c, sof(c) * sizeof(unsigned int));
  memcpy(buff + sof(c), &t, sof(t) * sizeof(unsigned int));
  for (i = 0; i < sof(buff); i++)
    rnd += buff[i];
  return rnd;
}